

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_set.c
# Opt level: O2

int mpt_string_set(char **ptr,char *data,int len)

{
  size_t sVar1;
  char *__dest;
  
  if (data != (char *)0x0) {
    if (len < 0) {
      sVar1 = strlen(data);
      len = (int)sVar1;
    }
    if (len != 0) {
      if (*ptr == data) {
        return 0;
      }
      __dest = (char *)realloc(*ptr,(long)(len + 1));
      if (__dest == (char *)0x0) {
        return -4;
      }
      memcpy(__dest,data,(long)len);
      *ptr = __dest;
      __dest[len] = '\0';
      return len;
    }
  }
  free(*ptr);
  *ptr = (char *)0x0;
  return 0;
}

Assistant:

extern int mpt_string_set(char **ptr, const char *data, int len)
{
	char *txt;
	
	if (!data) {
		len = 0;
	}
	else if (len < 0) {
		len = strlen(data);
	}
	if (!len) {
		free(*ptr);
		*ptr = 0;
		return 0;
	}
	if (data == *ptr) {
		return 0;
	}
	if (!(txt = realloc(*ptr, len + 1))) {
		return MPT_ERROR(BadOperation);
	}
	*ptr = memcpy(txt, data, len);
	txt[len] = 0;
	
	return len;
}